

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s-ref.c
# Opt level: O3

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  long in_FS_OFFSET;
  uint local_78 [4];
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58 [4];
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = *(int *)in;
  iVar4 = *(int *)(in + 4);
  iVar5 = *(int *)(in + 8);
  iVar6 = *(int *)(in + 0xc);
  iVar7 = *(int *)(in + 0x10);
  iVar8 = *(int *)(in + 0x14);
  iVar9 = *(int *)(in + 0x18);
  iVar10 = *(int *)(in + 0x1c);
  iVar11 = *(int *)(in + 0x20);
  iVar12 = *(int *)(in + 0x24);
  iVar13 = *(int *)(in + 0x28);
  iVar14 = *(int *)(in + 0x2c);
  iVar15 = *(int *)(in + 0x30);
  iVar16 = *(int *)(in + 0x34);
  iVar17 = *(int *)(in + 0x38);
  iVar18 = *(int *)(in + 0x3c);
  local_78[0] = (uint)*(undefined8 *)S->h;
  uVar21 = local_78[0] + S->h[4] + iVar3;
  uVar22 = uVar21 ^ S->t[0] ^ 0x510e527f;
  uVar23 = uVar22 << 0x10 | uVar22 >> 0x10;
  uVar22 = uVar23 + 0x6a09e667 ^ S->h[4];
  uVar25 = uVar22 << 0x14 | uVar22 >> 0xc;
  local_78[1] = (uint)((ulong)*(undefined8 *)S->h >> 0x20);
  uVar22 = local_78[1] + S->h[5] + iVar5;
  uVar19 = uVar22 ^ S->t[1] ^ 0x9b05688c;
  uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
  uVar28 = uVar19 + 0xbb67ae85 ^ S->h[5];
  uVar24 = iVar4 + uVar21 + uVar25;
  uVar21 = uVar24 ^ uVar23;
  uVar31 = uVar21 << 0x18 | uVar21 >> 8;
  local_58[0] = uVar23 + uVar31 + 0x6a09e667;
  uVar25 = uVar25 ^ local_58[0];
  uVar26 = uVar25 << 0x19 | uVar25 >> 7;
  uVar29 = uVar28 << 0x14 | uVar28 >> 0xc;
  local_78[2] = (uint)*(undefined8 *)(S->h + 2);
  uVar23 = local_78[2] + S->h[6] + iVar7;
  uVar21 = uVar23 ^ S->f[0] ^ 0x1f83d9ab;
  uVar28 = uVar21 << 0x10 | uVar21 >> 0x10;
  uVar21 = uVar28 + 0x3c6ef372 ^ S->h[6];
  uVar25 = iVar6 + uVar22 + uVar29;
  uVar22 = uVar25 ^ uVar19;
  uVar27 = uVar22 << 0x18 | uVar22 >> 8;
  local_58[1] = uVar19 + uVar27 + 0xbb67ae85;
  uVar29 = uVar29 ^ local_58[1];
  uVar30 = uVar29 << 0x19 | uVar29 >> 7;
  uVar29 = uVar21 << 0x14 | uVar21 >> 0xc;
  local_78[3] = (uint)((ulong)*(undefined8 *)(S->h + 2) >> 0x20);
  uVar22 = local_78[3] + S->h[7] + iVar9;
  uVar19 = uVar22 ^ S->f[1] ^ 0x5be0cd19;
  uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
  uVar21 = uVar19 + 0xa54ff53a ^ S->h[7];
  uVar23 = iVar8 + uVar23 + uVar29;
  uVar32 = uVar23 ^ uVar28;
  uVar33 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[2] = uVar33 + uVar28 + 0x3c6ef372;
  uVar29 = uVar29 ^ local_58[2];
  uVar28 = uVar29 << 0x19 | uVar29 >> 7;
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar32 = iVar10 + uVar22 + uVar21;
  uVar22 = uVar32 ^ uVar19;
  uVar29 = uVar22 << 0x18 | uVar22 >> 8;
  local_58[3] = uVar19 + uVar29 + 0xa54ff53a;
  uVar21 = uVar21 ^ local_58[3];
  uVar22 = uVar21 << 0x19 | uVar21 >> 7;
  uVar19 = uVar24 + iVar11 + uVar30;
  uVar29 = uVar29 ^ uVar19;
  uVar21 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_58[2] = local_58[2] + uVar21;
  uVar30 = uVar30 ^ local_58[2];
  uVar24 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar19 = uVar19 + iVar12 + uVar24;
  uVar21 = uVar21 ^ uVar19;
  uVar29 = uVar21 << 0x18 | uVar21 >> 8;
  local_58[2] = local_58[2] + uVar29;
  uVar24 = uVar24 ^ local_58[2];
  uVar30 = uVar24 << 0x19 | uVar24 >> 7;
  uVar21 = uVar25 + iVar13 + uVar28;
  uVar31 = uVar31 ^ uVar21;
  uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[3] = local_58[3] + uVar31;
  uVar28 = uVar28 ^ local_58[3];
  uVar25 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar24 = uVar21 + iVar14 + uVar25;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 << 0x18 | uVar31 >> 8;
  local_58[3] = local_58[3] + uVar31;
  uVar25 = uVar25 ^ local_58[3];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar21 = uVar23 + iVar15 + uVar22;
  uVar27 = uVar27 ^ uVar21;
  uVar23 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_58[0] = local_58[0] + uVar23;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar21 = uVar21 + iVar16 + uVar22;
  uVar23 = uVar23 ^ uVar21;
  uVar27 = uVar23 << 0x18 | uVar23 >> 8;
  local_58[0] = local_58[0] + uVar27;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar23 = uVar32 + iVar17 + uVar26;
  uVar33 = uVar33 ^ uVar23;
  uVar33 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[1] = local_58[1] + uVar33;
  uVar26 = uVar26 ^ local_58[1];
  uVar32 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar28 = uVar23 + iVar18 + uVar32;
  uVar33 = uVar33 ^ uVar28;
  uVar33 = uVar33 << 0x18 | uVar33 >> 8;
  local_58[1] = local_58[1] + uVar33;
  uVar32 = uVar32 ^ local_58[1];
  uVar23 = uVar32 << 0x19 | uVar32 >> 7;
  uVar19 = uVar19 + iVar17 + uVar23;
  uVar31 = uVar31 ^ uVar19;
  uVar32 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[0] = local_58[0] + uVar32;
  uVar23 = uVar23 ^ local_58[0];
  uVar23 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar19 = uVar19 + iVar13 + uVar23;
  uVar32 = uVar32 ^ uVar19;
  uVar31 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[0] = local_58[0] + uVar31;
  uVar23 = uVar23 ^ local_58[0];
  uVar32 = uVar23 << 0x19 | uVar23 >> 7;
  uVar23 = uVar24 + iVar7 + uVar30;
  uVar27 = uVar27 ^ uVar23;
  uVar24 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_58[1] = local_58[1] + uVar24;
  uVar30 = uVar30 ^ local_58[1];
  uVar27 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar23 = uVar23 + iVar11 + uVar27;
  uVar24 = uVar24 ^ uVar23;
  uVar26 = uVar24 << 0x18 | uVar24 >> 8;
  local_58[1] = local_58[1] + uVar26;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar21 = uVar21 + iVar12 + uVar25;
  uVar33 = uVar33 ^ uVar21;
  uVar30 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[2] = local_58[2] + uVar30;
  uVar25 = uVar25 ^ local_58[2];
  uVar24 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar21 = uVar21 + iVar18 + uVar24;
  uVar30 = uVar30 ^ uVar21;
  uVar33 = uVar30 << 0x18 | uVar30 >> 8;
  local_58[2] = local_58[2] + uVar33;
  uVar24 = uVar24 ^ local_58[2];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar28 = uVar28 + iVar16 + uVar22;
  uVar29 = uVar29 ^ uVar28;
  uVar25 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_58[3] = local_58[3] + uVar25;
  uVar22 = uVar22 ^ local_58[3];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar28 = uVar28 + iVar9 + uVar22;
  uVar25 = uVar25 ^ uVar28;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[3] = local_58[3] + uVar25;
  uVar22 = uVar22 ^ local_58[3];
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar19 = uVar19 + iVar4 + uVar27;
  uVar25 = uVar25 ^ uVar19;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[2] = local_58[2] + uVar25;
  uVar27 = uVar27 ^ local_58[2];
  uVar29 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar19 = uVar19 + iVar15 + uVar29;
  uVar25 = uVar25 ^ uVar19;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[2] = local_58[2] + uVar25;
  uVar29 = uVar29 ^ local_58[2];
  uVar27 = uVar29 << 0x19 | uVar29 >> 7;
  uVar23 = uVar23 + iVar3 + uVar24;
  uVar31 = uVar31 ^ uVar23;
  uVar29 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[3] = local_58[3] + uVar29;
  uVar24 = uVar24 ^ local_58[3];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar23 = uVar23 + iVar5 + uVar24;
  uVar29 = uVar29 ^ uVar23;
  uVar30 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[3] = local_58[3] + uVar30;
  uVar24 = uVar24 ^ local_58[3];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar21 = uVar21 + iVar14 + uVar22;
  uVar26 = uVar26 ^ uVar21;
  uVar29 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[0] = local_58[0] + uVar29;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar21 = uVar21 + iVar10 + uVar22;
  uVar29 = uVar29 ^ uVar21;
  uVar26 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[0] = local_58[0] + uVar26;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar28 = uVar28 + iVar8 + uVar32;
  uVar33 = uVar33 ^ uVar28;
  uVar31 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[1] = local_58[1] + uVar31;
  uVar32 = uVar32 ^ local_58[1];
  uVar29 = uVar32 << 0x14 | uVar32 >> 0xc;
  uVar28 = uVar28 + iVar6 + uVar29;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x18 | uVar31 >> 8;
  local_58[1] = local_58[1] + uVar31;
  uVar29 = uVar29 ^ local_58[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar19 = uVar19 + iVar14 + uVar29;
  uVar30 = uVar30 ^ uVar19;
  uVar32 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[0] = local_58[0] + uVar32;
  uVar29 = uVar29 ^ local_58[0];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar19 = uVar19 + iVar11 + uVar29;
  uVar32 = uVar32 ^ uVar19;
  uVar30 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[0] = local_58[0] + uVar30;
  uVar29 = uVar29 ^ local_58[0];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar23 = uVar23 + iVar15 + uVar27;
  uVar26 = uVar26 ^ uVar23;
  uVar32 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[1] = local_58[1] + uVar32;
  uVar27 = uVar27 ^ local_58[1];
  uVar26 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar23 = uVar23 + iVar3 + uVar26;
  uVar32 = uVar32 ^ uVar23;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[1] = local_58[1] + uVar32;
  uVar26 = uVar26 ^ local_58[1];
  uVar26 = uVar26 << 0x19 | uVar26 >> 7;
  uVar21 = uVar21 + iVar8 + uVar24;
  uVar31 = uVar31 ^ uVar21;
  uVar27 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[2] = local_58[2] + uVar27;
  uVar24 = uVar24 ^ local_58[2];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar21 = uVar21 + iVar5 + uVar24;
  uVar27 = uVar27 ^ uVar21;
  uVar31 = uVar27 << 0x18 | uVar27 >> 8;
  local_58[2] = local_58[2] + uVar31;
  uVar24 = uVar24 ^ local_58[2];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar28 = uVar28 + iVar18 + uVar22;
  uVar25 = uVar25 ^ uVar28;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[3] = local_58[3] + uVar25;
  uVar22 = uVar22 ^ local_58[3];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar28 = uVar28 + iVar16 + uVar22;
  uVar25 = uVar25 ^ uVar28;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[3] = local_58[3] + uVar25;
  uVar22 = uVar22 ^ local_58[3];
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar19 = uVar19 + iVar13 + uVar26;
  uVar25 = uVar25 ^ uVar19;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[2] = local_58[2] + uVar25;
  uVar26 = uVar26 ^ local_58[2];
  uVar26 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar19 = uVar19 + iVar17 + uVar26;
  uVar25 = uVar25 ^ uVar19;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[2] = local_58[2] + uVar25;
  uVar26 = uVar26 ^ local_58[2];
  uVar27 = uVar26 << 0x19 | uVar26 >> 7;
  uVar23 = uVar23 + iVar6 + uVar24;
  uVar30 = uVar30 ^ uVar23;
  uVar26 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[3] = local_58[3] + uVar26;
  uVar24 = uVar24 ^ local_58[3];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar23 = uVar23 + iVar9 + uVar24;
  uVar26 = uVar26 ^ uVar23;
  uVar30 = uVar26 << 0x18 | uVar26 >> 8;
  local_58[3] = local_58[3] + uVar30;
  uVar24 = uVar24 ^ local_58[3];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar21 = uVar21 + iVar10 + uVar22;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_58[0] = local_58[0] + uVar32;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar21 = uVar21 + iVar4 + uVar22;
  uVar32 = uVar32 ^ uVar21;
  uVar26 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[0] = local_58[0] + uVar26;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar28 = uVar28 + iVar12 + uVar29;
  uVar31 = uVar31 ^ uVar28;
  uVar32 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[1] = local_58[1] + uVar32;
  uVar29 = uVar29 ^ local_58[1];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar28 = uVar28 + iVar7 + uVar29;
  uVar32 = uVar32 ^ uVar28;
  uVar31 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[1] = local_58[1] + uVar31;
  uVar29 = uVar29 ^ local_58[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar19 = uVar19 + iVar10 + uVar29;
  uVar30 = uVar30 ^ uVar19;
  uVar32 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[0] = local_58[0] + uVar32;
  uVar29 = uVar29 ^ local_58[0];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar19 = uVar19 + iVar12 + uVar29;
  uVar32 = uVar32 ^ uVar19;
  uVar30 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[0] = local_58[0] + uVar30;
  uVar29 = uVar29 ^ local_58[0];
  uVar32 = uVar29 << 0x19 | uVar29 >> 7;
  uVar23 = uVar23 + iVar6 + uVar27;
  uVar26 = uVar26 ^ uVar23;
  uVar29 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[1] = local_58[1] + uVar29;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar23 = uVar23 + iVar4 + uVar27;
  uVar29 = uVar29 ^ uVar23;
  uVar26 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[1] = local_58[1] + uVar26;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar21 = uVar21 + iVar16 + uVar24;
  uVar31 = uVar31 ^ uVar21;
  uVar29 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[2] = local_58[2] + uVar29;
  uVar24 = uVar24 ^ local_58[2];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar21 = uVar21 + iVar15 + uVar24;
  uVar29 = uVar29 ^ uVar21;
  uVar31 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[2] = local_58[2] + uVar31;
  uVar24 = uVar24 ^ local_58[2];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar28 = uVar28 + iVar14 + uVar22;
  uVar25 = uVar25 ^ uVar28;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[3] = local_58[3] + uVar25;
  uVar22 = uVar22 ^ local_58[3];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar29 = uVar28 + iVar17 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[3] = local_58[3] + uVar25;
  uVar22 = uVar22 ^ local_58[3];
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar19 = uVar19 + iVar5 + uVar27;
  uVar25 = uVar25 ^ uVar19;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[2] = local_58[2] + uVar25;
  uVar27 = uVar27 ^ local_58[2];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar19 = uVar19 + iVar9 + uVar27;
  uVar25 = uVar25 ^ uVar19;
  uVar28 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[2] = local_58[2] + uVar28;
  uVar27 = uVar27 ^ local_58[2];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar23 = uVar23 + iVar8 + uVar24;
  uVar30 = uVar30 ^ uVar23;
  uVar30 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[3] = local_58[3] + uVar30;
  uVar24 = uVar24 ^ local_58[3];
  uVar25 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar24 = uVar23 + iVar13 + uVar25;
  uVar30 = uVar30 ^ uVar24;
  uVar30 = uVar30 << 0x18 | uVar30 >> 8;
  local_58[3] = local_58[3] + uVar30;
  uVar25 = uVar25 ^ local_58[3];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar21 = uVar21 + iVar7 + uVar22;
  uVar26 = uVar26 ^ uVar21;
  uVar26 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[0] = local_58[0] + uVar26;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar23 = uVar21 + iVar3 + uVar22;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 << 0x18 | uVar26 >> 8;
  local_58[0] = local_58[0] + uVar26;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar21 = uVar29 + iVar18 + uVar32;
  uVar31 = uVar31 ^ uVar21;
  uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[1] = local_58[1] + uVar31;
  uVar32 = uVar32 ^ local_58[1];
  uVar32 = uVar32 << 0x14 | uVar32 >> 0xc;
  uVar29 = uVar21 + iVar11 + uVar32;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x18 | uVar31 >> 8;
  local_58[1] = local_58[1] + uVar31;
  uVar32 = uVar32 ^ local_58[1];
  uVar21 = uVar32 << 0x19 | uVar32 >> 7;
  uVar19 = uVar19 + iVar12 + uVar21;
  uVar30 = uVar30 ^ uVar19;
  uVar30 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[0] = local_58[0] + uVar30;
  uVar21 = uVar21 ^ local_58[0];
  uVar32 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar21 = uVar19 + iVar3 + uVar32;
  uVar30 = uVar30 ^ uVar21;
  uVar30 = uVar30 << 0x18 | uVar30 >> 8;
  local_58[0] = local_58[0] + uVar30;
  uVar32 = uVar32 ^ local_58[0];
  uVar32 = uVar32 << 0x19 | uVar32 >> 7;
  uVar19 = uVar24 + iVar8 + uVar27;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[1] = local_58[1] + uVar26;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar24 = uVar19 + iVar10 + uVar27;
  uVar26 = uVar26 ^ uVar24;
  uVar26 = uVar26 << 0x18 | uVar26 >> 8;
  local_58[1] = local_58[1] + uVar26;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar19 = uVar23 + iVar5 + uVar25;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[2] = local_58[2] + uVar31;
  uVar25 = uVar25 ^ local_58[2];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar23 = uVar19 + iVar7 + uVar25;
  uVar31 = uVar31 ^ uVar23;
  uVar31 = uVar31 << 0x18 | uVar31 >> 8;
  local_58[2] = local_58[2] + uVar31;
  uVar25 = uVar25 ^ local_58[2];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar29 = uVar29 + iVar13 + uVar22;
  uVar28 = uVar28 ^ uVar29;
  uVar28 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_58[3] = local_58[3] + uVar28;
  uVar22 = uVar22 ^ local_58[3];
  uVar19 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar22 = uVar29 + iVar18 + uVar19;
  uVar28 = uVar28 ^ uVar22;
  uVar28 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[3] = local_58[3] + uVar28;
  uVar19 = uVar19 ^ local_58[3];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar21 = uVar21 + iVar17 + uVar27;
  uVar28 = uVar28 ^ uVar21;
  uVar28 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_58[2] = local_58[2] + uVar28;
  uVar27 = uVar27 ^ local_58[2];
  uVar29 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar21 = uVar21 + iVar4 + uVar29;
  uVar28 = uVar28 ^ uVar21;
  uVar28 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[2] = local_58[2] + uVar28;
  uVar29 = uVar29 ^ local_58[2];
  uVar27 = uVar29 << 0x19 | uVar29 >> 7;
  uVar24 = uVar24 + iVar14 + uVar25;
  uVar30 = uVar30 ^ uVar24;
  uVar29 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[3] = local_58[3] + uVar29;
  uVar25 = uVar25 ^ local_58[3];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar24 = uVar24 + iVar15 + uVar25;
  uVar29 = uVar29 ^ uVar24;
  uVar30 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[3] = local_58[3] + uVar30;
  uVar25 = uVar25 ^ local_58[3];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar23 = uVar23 + iVar9 + uVar19;
  uVar26 = uVar26 ^ uVar23;
  uVar29 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[0] = local_58[0] + uVar29;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar23 = uVar23 + iVar11 + uVar19;
  uVar29 = uVar29 ^ uVar23;
  uVar26 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[0] = local_58[0] + uVar26;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar22 = uVar22 + iVar6 + uVar32;
  uVar31 = uVar31 ^ uVar22;
  uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[1] = local_58[1] + uVar31;
  uVar32 = uVar32 ^ local_58[1];
  uVar29 = uVar32 << 0x14 | uVar32 >> 0xc;
  uVar22 = uVar22 + iVar16 + uVar29;
  uVar31 = uVar31 ^ uVar22;
  uVar31 = uVar31 << 0x18 | uVar31 >> 8;
  local_58[1] = local_58[1] + uVar31;
  uVar29 = uVar29 ^ local_58[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar21 = uVar21 + iVar5 + uVar29;
  uVar30 = uVar30 ^ uVar21;
  uVar32 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[0] = local_58[0] + uVar32;
  uVar29 = uVar29 ^ local_58[0];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar21 = uVar21 + iVar15 + uVar29;
  uVar32 = uVar32 ^ uVar21;
  uVar30 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[0] = local_58[0] + uVar30;
  uVar29 = uVar29 ^ local_58[0];
  uVar32 = uVar29 << 0x19 | uVar29 >> 7;
  uVar24 = uVar24 + iVar9 + uVar27;
  uVar26 = uVar26 ^ uVar24;
  uVar29 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[1] = local_58[1] + uVar29;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar24 = uVar24 + iVar13 + uVar27;
  uVar29 = uVar29 ^ uVar24;
  uVar26 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[1] = local_58[1] + uVar26;
  uVar27 = uVar27 ^ local_58[1];
  uVar29 = uVar27 << 0x19 | uVar27 >> 7;
  uVar23 = uVar23 + iVar3 + uVar25;
  uVar31 = uVar31 ^ uVar23;
  uVar27 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[2] = local_58[2] + uVar27;
  uVar25 = uVar25 ^ local_58[2];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar23 = uVar23 + iVar14 + uVar25;
  uVar27 = uVar27 ^ uVar23;
  uVar31 = uVar27 << 0x18 | uVar27 >> 8;
  local_58[2] = local_58[2] + uVar31;
  uVar25 = uVar25 ^ local_58[2];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar22 = uVar22 + iVar11 + uVar19;
  uVar28 = uVar28 ^ uVar22;
  uVar28 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_58[3] = local_58[3] + uVar28;
  uVar19 = uVar19 ^ local_58[3];
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar22 = uVar22 + iVar6 + uVar19;
  uVar28 = uVar28 ^ uVar22;
  uVar28 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[3] = local_58[3] + uVar28;
  uVar19 = uVar19 ^ local_58[3];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar21 = uVar21 + iVar7 + uVar29;
  uVar28 = uVar28 ^ uVar21;
  uVar28 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_58[2] = local_58[2] + uVar28;
  uVar29 = uVar29 ^ local_58[2];
  uVar27 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar21 = uVar21 + iVar16 + uVar27;
  uVar28 = uVar28 ^ uVar21;
  uVar29 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[2] = local_58[2] + uVar29;
  uVar27 = uVar27 ^ local_58[2];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar24 = uVar24 + iVar10 + uVar25;
  uVar30 = uVar30 ^ uVar24;
  uVar28 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[3] = local_58[3] + uVar28;
  uVar25 = uVar25 ^ local_58[3];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar24 = uVar24 + iVar8 + uVar25;
  uVar28 = uVar28 ^ uVar24;
  uVar30 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[3] = local_58[3] + uVar30;
  uVar25 = uVar25 ^ local_58[3];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar23 = uVar23 + iVar18 + uVar19;
  uVar26 = uVar26 ^ uVar23;
  uVar28 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[0] = local_58[0] + uVar28;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar23 = uVar23 + iVar17 + uVar19;
  uVar28 = uVar28 ^ uVar23;
  uVar26 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[0] = local_58[0] + uVar26;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar22 = uVar22 + iVar4 + uVar32;
  uVar31 = uVar31 ^ uVar22;
  uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[1] = local_58[1] + uVar31;
  uVar32 = uVar32 ^ local_58[1];
  uVar28 = uVar32 << 0x14 | uVar32 >> 0xc;
  uVar22 = uVar22 + iVar12 + uVar28;
  uVar31 = uVar31 ^ uVar22;
  uVar33 = uVar31 << 0x18 | uVar31 >> 8;
  local_58[1] = local_58[1] + uVar33;
  uVar28 = uVar28 ^ local_58[1];
  uVar28 = uVar28 << 0x19 | uVar28 >> 7;
  uVar21 = uVar21 + iVar15 + uVar28;
  uVar30 = uVar30 ^ uVar21;
  uVar32 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[0] = local_58[0] + uVar32;
  uVar28 = uVar28 ^ local_58[0];
  uVar28 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar21 = uVar21 + iVar8 + uVar28;
  uVar32 = uVar32 ^ uVar21;
  uVar31 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[0] = local_58[0] + uVar31;
  uVar28 = uVar28 ^ local_58[0];
  uVar32 = uVar28 << 0x19 | uVar28 >> 7;
  uVar24 = uVar24 + iVar4 + uVar27;
  uVar26 = uVar26 ^ uVar24;
  uVar28 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[1] = local_58[1] + uVar28;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar24 = uVar24 + iVar18 + uVar27;
  uVar28 = uVar28 ^ uVar24;
  uVar26 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[1] = local_58[1] + uVar26;
  uVar27 = uVar27 ^ local_58[1];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar23 = uVar23 + iVar17 + uVar25;
  uVar33 = uVar33 ^ uVar23;
  uVar30 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[2] = local_58[2] + uVar30;
  uVar25 = uVar25 ^ local_58[2];
  uVar28 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar23 = uVar23 + iVar16 + uVar28;
  uVar30 = uVar30 ^ uVar23;
  uVar33 = uVar30 << 0x18 | uVar30 >> 8;
  local_58[2] = local_58[2] + uVar33;
  uVar22 = uVar22 + iVar7 + uVar19;
  uVar29 = uVar29 ^ uVar22;
  uVar25 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_58[3] = local_58[3] + uVar25;
  uVar19 = uVar19 ^ local_58[3];
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar22 = uVar22 + iVar13 + uVar19;
  uVar25 = uVar25 ^ uVar22;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  uVar28 = uVar28 ^ local_58[2];
  local_58[3] = local_58[3] + uVar25;
  uVar21 = uVar21 + iVar3 + uVar27;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[2] = local_58[2] + uVar25;
  uVar27 = uVar27 ^ local_58[2];
  uVar29 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar21 = uVar21 + iVar10 + uVar29;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[2] = uVar25 + local_58[2];
  uVar28 = uVar28 << 0x19 | uVar28 >> 7;
  uVar19 = uVar19 ^ local_58[3];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar29 = uVar29 ^ local_58[2];
  uVar30 = uVar29 << 0x19 | uVar29 >> 7;
  uVar24 = uVar24 + iVar9 + uVar28;
  uVar31 = uVar31 ^ uVar24;
  uVar29 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[3] = local_58[3] + uVar29;
  uVar28 = uVar28 ^ local_58[3];
  uVar28 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar24 = uVar24 + iVar6 + uVar28;
  uVar29 = uVar29 ^ uVar24;
  uVar31 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[3] = local_58[3] + uVar31;
  uVar28 = uVar28 ^ local_58[3];
  uVar28 = uVar28 << 0x19 | uVar28 >> 7;
  uVar23 = uVar23 + iVar12 + uVar19;
  uVar26 = uVar26 ^ uVar23;
  uVar29 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[0] = local_58[0] + uVar29;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar23 = uVar23 + iVar5 + uVar19;
  uVar29 = uVar29 ^ uVar23;
  uVar27 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[0] = local_58[0] + uVar27;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar22 = uVar22 + iVar11 + uVar32;
  uVar33 = uVar33 ^ uVar22;
  uVar26 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[1] = local_58[1] + uVar26;
  uVar32 = uVar32 ^ local_58[1];
  uVar29 = uVar32 << 0x14 | uVar32 >> 0xc;
  uVar22 = uVar22 + iVar14 + uVar29;
  uVar26 = uVar26 ^ uVar22;
  uVar34 = uVar26 << 0x18 | uVar26 >> 8;
  local_58[1] = local_58[1] + uVar34;
  uVar29 = uVar29 ^ local_58[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar21 = uVar21 + iVar16 + uVar29;
  uVar31 = uVar31 ^ uVar21;
  uVar32 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_58[0] = local_58[0] + uVar32;
  uVar29 = uVar29 ^ local_58[0];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar21 = uVar21 + iVar14 + uVar29;
  uVar32 = uVar32 ^ uVar21;
  uVar33 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[0] = local_58[0] + uVar33;
  uVar29 = uVar29 ^ local_58[0];
  uVar26 = uVar29 << 0x19 | uVar29 >> 7;
  uVar24 = uVar24 + iVar10 + uVar30;
  uVar27 = uVar27 ^ uVar24;
  uVar29 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_58[1] = local_58[1] + uVar29;
  uVar30 = uVar30 ^ local_58[1];
  uVar32 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar24 = uVar24 + iVar17 + uVar32;
  uVar29 = uVar29 ^ uVar24;
  uVar27 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[1] = local_58[1] + uVar27;
  uVar32 = uVar32 ^ local_58[1];
  uVar29 = uVar32 << 0x19 | uVar32 >> 7;
  uVar23 = uVar23 + iVar15 + uVar28;
  uVar34 = uVar34 ^ uVar23;
  uVar32 = uVar34 << 0x10 | uVar34 >> 0x10;
  local_58[2] = local_58[2] + uVar32;
  uVar28 = uVar28 ^ local_58[2];
  uVar28 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar23 = uVar23 + iVar4 + uVar28;
  uVar32 = uVar32 ^ uVar23;
  uVar34 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[2] = local_58[2] + uVar34;
  uVar28 = uVar28 ^ local_58[2];
  uVar28 = uVar28 << 0x19 | uVar28 >> 7;
  uVar22 = uVar22 + iVar6 + uVar19;
  uVar25 = uVar25 ^ uVar22;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[3] = local_58[3] + uVar25;
  uVar19 = uVar19 ^ local_58[3];
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar22 = uVar22 + iVar12 + uVar19;
  uVar25 = uVar25 ^ uVar22;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[3] = local_58[3] + uVar25;
  uVar19 = uVar19 ^ local_58[3];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar21 = uVar21 + iVar8 + uVar29;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[2] = local_58[2] + uVar25;
  uVar29 = uVar29 ^ local_58[2];
  uVar32 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar21 = uVar21 + iVar3 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar29 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[2] = uVar29 + local_58[2];
  uVar32 = uVar32 ^ local_58[2];
  uVar31 = uVar32 << 0x19 | uVar32 >> 7;
  uVar24 = uVar24 + iVar18 + uVar28;
  uVar33 = uVar33 ^ uVar24;
  uVar32 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[3] = local_58[3] + uVar32;
  uVar28 = uVar28 ^ local_58[3];
  uVar28 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar25 = uVar24 + iVar7 + uVar28;
  uVar32 = uVar32 ^ uVar25;
  uVar33 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[3] = local_58[3] + uVar33;
  uVar28 = uVar28 ^ local_58[3];
  uVar32 = uVar28 << 0x19 | uVar28 >> 7;
  uVar23 = uVar23 + iVar11 + uVar19;
  uVar27 = uVar27 ^ uVar23;
  uVar28 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_58[0] = local_58[0] + uVar28;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar24 = uVar23 + iVar9 + uVar19;
  uVar28 = uVar28 ^ uVar24;
  uVar30 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[0] = local_58[0] + uVar30;
  uVar19 = uVar19 ^ local_58[0];
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar22 = uVar22 + iVar5 + uVar26;
  uVar34 = uVar34 ^ uVar22;
  uVar28 = uVar34 << 0x10 | uVar34 >> 0x10;
  local_58[1] = local_58[1] + uVar28;
  uVar26 = uVar26 ^ local_58[1];
  uVar23 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar22 = uVar22 + iVar13 + uVar23;
  uVar28 = uVar28 ^ uVar22;
  uVar34 = uVar28 << 0x18 | uVar28 >> 8;
  local_58[1] = local_58[1] + uVar34;
  uVar23 = uVar23 ^ local_58[1];
  uVar23 = uVar23 << 0x19 | uVar23 >> 7;
  uVar21 = uVar21 + iVar9 + uVar23;
  uVar33 = uVar33 ^ uVar21;
  uVar26 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[0] = local_58[0] + uVar26;
  uVar23 = uVar23 ^ local_58[0];
  uVar28 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar23 = uVar21 + iVar18 + uVar28;
  uVar26 = uVar26 ^ uVar23;
  uVar33 = uVar26 << 0x18 | uVar26 >> 8;
  local_58[0] = local_58[0] + uVar33;
  uVar28 = uVar28 ^ local_58[0];
  uVar27 = uVar28 << 0x19 | uVar28 >> 7;
  uVar21 = uVar25 + iVar17 + uVar31;
  uVar30 = uVar30 ^ uVar21;
  uVar25 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[1] = local_58[1] + uVar25;
  uVar31 = uVar31 ^ local_58[1];
  uVar26 = uVar31 << 0x14 | uVar31 >> 0xc;
  uVar28 = uVar21 + iVar12 + uVar26;
  uVar25 = uVar25 ^ uVar28;
  uVar30 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[1] = local_58[1] + uVar30;
  uVar26 = uVar26 ^ local_58[1];
  uVar26 = uVar26 << 0x19 | uVar26 >> 7;
  uVar21 = uVar24 + iVar14 + uVar32;
  uVar34 = uVar34 ^ uVar21;
  uVar31 = uVar34 << 0x10 | uVar34 >> 0x10;
  local_58[2] = local_58[2] + uVar31;
  uVar32 = uVar32 ^ local_58[2];
  uVar24 = uVar32 << 0x14 | uVar32 >> 0xc;
  uVar25 = uVar21 + iVar6 + uVar24;
  uVar31 = uVar31 ^ uVar25;
  uVar34 = uVar31 << 0x18 | uVar31 >> 8;
  local_58[2] = local_58[2] + uVar34;
  uVar24 = uVar24 ^ local_58[2];
  uVar22 = uVar22 + iVar3 + uVar19;
  uVar29 = uVar29 ^ uVar22;
  uVar29 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_58[3] = local_58[3] + uVar29;
  uVar19 = uVar19 ^ local_58[3];
  uVar21 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar22 = uVar22 + iVar11 + uVar21;
  uVar29 = uVar29 ^ uVar22;
  uVar29 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[3] = local_58[3] + uVar29;
  uVar19 = uVar23 + iVar15 + uVar26;
  uVar29 = uVar29 ^ uVar19;
  uVar29 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_58[2] = local_58[2] + uVar29;
  uVar26 = uVar26 ^ local_58[2];
  uVar31 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar23 = uVar19 + iVar5 + uVar31;
  uVar29 = uVar29 ^ uVar23;
  uVar26 = uVar29 << 0x18 | uVar29 >> 8;
  local_58[2] = uVar26 + local_58[2];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar22 = uVar22 + uVar27 + iVar13;
  uVar21 = uVar21 ^ local_58[3];
  uVar19 = uVar28 + iVar16 + uVar24;
  uVar33 = uVar33 ^ uVar19;
  uVar32 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[3] = local_58[3] + uVar32;
  uVar24 = uVar24 ^ local_58[3];
  uVar29 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar28 = uVar19 + iVar10 + uVar29;
  uVar32 = uVar32 ^ uVar28;
  uVar33 = uVar32 << 0x18 | uVar32 >> 8;
  uVar34 = uVar34 ^ uVar22;
  uVar32 = uVar34 << 0x10 | uVar34 >> 0x10;
  local_58[1] = local_58[1] + uVar32;
  uVar27 = uVar27 ^ local_58[1];
  uVar24 = uVar27 << 0x14 | uVar27 >> 0xc;
  local_58[3] = local_58[3] + uVar33;
  uVar19 = uVar22 + iVar8 + uVar24;
  uVar32 = uVar32 ^ uVar19;
  uVar34 = uVar32 << 0x18 | uVar32 >> 8;
  local_58[1] = local_58[1] + uVar34;
  uVar24 = uVar24 ^ local_58[1];
  uVar32 = uVar24 << 0x19 | uVar24 >> 7;
  uVar24 = uVar23 + iVar13 + uVar32;
  uVar33 = uVar33 ^ uVar24;
  uVar22 = uVar21 << 0x19 | uVar21 >> 7;
  uVar31 = uVar31 ^ local_58[2];
  uVar31 = uVar31 << 0x19 | uVar31 >> 7;
  uVar29 = uVar29 ^ local_58[3];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar21 = uVar25 + iVar4 + uVar22;
  uVar30 = uVar30 ^ uVar21;
  uVar23 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[0] = local_58[0] + uVar23;
  uVar22 = uVar22 ^ local_58[0];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar21 = uVar21 + iVar7 + uVar22;
  uVar23 = uVar23 ^ uVar21;
  uVar27 = uVar23 << 0x18 | uVar23 >> 8;
  local_58[0] = local_58[0] + uVar27;
  uVar22 = uVar22 ^ local_58[0];
  uVar23 = uVar22 << 0x19 | uVar22 >> 7;
  uVar25 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[0] = local_58[0] + uVar25;
  uVar32 = uVar32 ^ local_58[0];
  uVar22 = uVar32 << 0x14 | uVar32 >> 0xc;
  uVar24 = uVar24 + iVar5 + uVar22;
  uVar25 = uVar25 ^ uVar24;
  uVar33 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[0] = local_58[0] + uVar33;
  uVar22 = local_58[0] ^ uVar22;
  uVar22 = uVar22 << 0x19 | uVar22 >> 7;
  uVar25 = uVar28 + iVar11 + uVar31;
  uVar27 = uVar27 ^ uVar25;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_58[1] = local_58[1] + uVar27;
  uVar31 = uVar31 ^ local_58[1];
  uVar28 = uVar31 << 0x14 | uVar31 >> 0xc;
  uVar32 = uVar25 + iVar7 + uVar28;
  uVar27 = uVar27 ^ uVar32;
  uVar30 = uVar27 << 0x18 | uVar27 >> 8;
  local_58[1] = local_58[1] + uVar30;
  uVar28 = local_58[1] ^ uVar28;
  uVar21 = uVar21 + uVar29 + iVar10;
  uVar34 = uVar34 ^ uVar21;
  uVar25 = uVar34 << 0x10 | uVar34 >> 0x10;
  local_58[2] = local_58[2] + uVar25;
  uVar29 = uVar29 ^ local_58[2];
  uVar27 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar29 = uVar21 + iVar9 + uVar27;
  uVar25 = uVar25 ^ uVar29;
  uVar21 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[2] = uVar21 + local_58[2];
  uVar19 = uVar19 + iVar4 + uVar23;
  uVar26 = uVar26 ^ uVar19;
  uVar28 = uVar28 << 0x19 | uVar28 >> 7;
  uVar27 = uVar27 ^ local_58[2];
  uVar25 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_58[3] = local_58[3] + uVar25;
  uVar23 = uVar23 ^ local_58[3];
  uVar23 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar19 = uVar19 + iVar8 + uVar23;
  uVar25 = uVar25 ^ uVar19;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[3] = local_58[3] + uVar25;
  uVar24 = uVar24 + iVar18 + uVar28;
  uVar25 = uVar25 ^ uVar24;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_58[2] = local_58[2] + uVar25;
  uVar28 = uVar28 ^ local_58[2];
  uVar28 = uVar28 << 0x14 | uVar28 >> 0xc;
  local_78[0] = uVar24 + iVar14 + uVar28;
  uVar25 = local_78[0] ^ uVar25;
  local_3c = uVar25 << 0x18 | uVar25 >> 8;
  local_58[2] = local_3c + local_58[2];
  uVar28 = local_58[2] ^ uVar28;
  uStack_64 = uVar28 << 0x19 | uVar28 >> 7;
  uVar28 = uVar27 << 0x19 | uVar27 >> 7;
  uVar24 = uVar32 + iVar12 + uVar28;
  uVar33 = uVar33 ^ uVar24;
  uVar23 = uVar23 ^ local_58[3];
  uVar25 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_58[3] = local_58[3] + uVar25;
  uVar28 = uVar28 ^ local_58[3];
  uVar28 = uVar28 << 0x14 | uVar28 >> 0xc;
  local_78[1] = uVar24 + iVar17 + uVar28;
  uVar25 = local_78[1] ^ uVar25;
  local_48 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[3] = local_48 + local_58[3];
  uVar28 = local_58[3] ^ uVar28;
  uStack_60 = uVar28 << 0x19 | uVar28 >> 7;
  uVar23 = uVar23 << 0x19 | uVar23 >> 7;
  uVar24 = uVar29 + iVar6 + uVar23;
  uVar30 = uVar30 ^ uVar24;
  uVar25 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_58[0] = local_58[0] + uVar25;
  uVar23 = uVar23 ^ local_58[0];
  uVar23 = uVar23 << 0x14 | uVar23 >> 0xc;
  local_78[2] = uVar24 + iVar15 + uVar23;
  uVar25 = local_78[2] ^ uVar25;
  local_44 = uVar25 << 0x18 | uVar25 >> 8;
  local_58[0] = local_44 + local_58[0];
  uVar23 = local_58[0] ^ uVar23;
  uStack_5c = uVar23 << 0x19 | uVar23 >> 7;
  uVar19 = iVar16 + uVar22 + uVar19;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 << 0x10 | uVar21 >> 0x10;
  local_58[1] = local_58[1] + uVar21;
  uVar22 = uVar22 ^ local_58[1];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  local_78[3] = uVar19 + iVar3 + uVar22;
  uVar21 = local_78[3] ^ uVar21;
  local_40 = uVar21 << 0x18 | uVar21 >> 8;
  local_58[1] = local_40 + local_58[1];
  uVar22 = local_58[1] ^ uVar22;
  local_68 = uVar22 << 0x19 | uVar22 >> 7;
  lVar20 = 0;
  do {
    puVar1 = S->h + lVar20;
    uVar22 = puVar1[1];
    uVar19 = puVar1[2];
    uVar21 = puVar1[3];
    uVar23 = local_78[lVar20 + 1];
    uVar24 = local_78[lVar20 + 2];
    uVar25 = local_78[lVar20 + 3];
    uVar28 = local_58[lVar20 + 1];
    uVar29 = local_58[lVar20 + 2];
    uVar32 = local_58[lVar20 + 3];
    puVar2 = S->h + lVar20;
    *puVar2 = *puVar1 ^ local_78[lVar20] ^ local_58[lVar20];
    puVar2[1] = uVar22 ^ uVar23 ^ uVar28;
    puVar2[2] = uVar19 ^ uVar24 ^ uVar29;
    puVar2[3] = uVar21 ^ uVar25 ^ uVar32;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}